

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_chat.cpp
# Opt level: O3

void CT_Drawer(void)

{
  FFont *pFVar1;
  DFrameBuffer *pDVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong local_50;
  
  if (chatmodeon != 0) {
    iVar7 = -0x1e;
    if (gamestate != GS_LEVEL) {
      iVar7 = -10;
    }
    if (viewactive) {
      iVar7 = -10;
    }
    iVar3 = active_con_scaletext();
    iVar15 = 1;
    iVar12 = 1;
    if (iVar3 == 0) {
      iVar15 = CleanXfac;
      iVar12 = CleanYfac;
    }
    iVar3 = active_con_scaletext();
    uVar9 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    uVar11 = (ulong)uVar9;
    if (iVar3 == 0) {
      uVar9 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
      local_50 = (ulong)uVar9;
      iVar3 = ST_Y;
    }
    else {
      iVar4 = active_con_scaletext();
      iVar3 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
      uVar11 = (long)(int)uVar9 / (long)iVar4 & 0xffffffff;
      iVar5 = active_con_scaletext();
      iVar4 = ST_Y;
      local_50 = (long)iVar3 / (long)iVar5 & 0xffffffff;
      iVar3 = active_con_scaletext();
      uVar9 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
      iVar3 = iVar4 / iVar3;
    }
    iVar4 = (int)local_50;
    if (((uVar9 != viewheight) || (viewactive == false)) && (gamestate == GS_LEVEL)) {
      iVar4 = iVar3;
    }
    iVar3 = FFont::StringWidth(SmallFont,(BYTE *)"Say: ");
    iVar3 = iVar3 * iVar15;
    iVar5 = (*SmallFont->_vptr_FFont[3])(SmallFont,0x5f);
    uVar13 = (ulong)len;
    uVar9 = len;
    if (0 < (long)uVar13) {
      iVar5 = iVar3 + iVar5 * iVar15 * 2;
      if (iVar5 < (int)uVar11) {
        do {
          uVar14 = uVar13 - 1;
          iVar6 = (*SmallFont->_vptr_FFont[3])
                            (SmallFont,(ulong)((byte)(&DAT_00a4e96f)[uVar13] & 0x7f));
          if (uVar13 < 2) break;
          iVar5 = iVar5 + iVar6 * iVar15;
          uVar13 = uVar14;
        } while (iVar5 < (int)uVar11);
        uVar9 = (uint)uVar14;
      }
    }
    iVar4 = iVar4 + iVar12 * iVar7;
    if ((int)uVar9 < 1) {
      uVar9 = 0;
    }
    lVar10 = (long)len;
    ChatQueue[lVar10] = SmallFont->Cursor;
    ChatQueue[lVar10 + 1] = '\0';
    iVar7 = active_con_scaletext();
    pDVar2 = screen;
    pFVar1 = SmallFont;
    if (iVar7 < 2) {
      iVar7 = active_con_scaletext();
      DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,3,0,iVar4,"Say: ",0x40001393,(ulong)(iVar7 == 0),0)
      ;
      pDVar2 = screen;
      pFVar1 = SmallFont;
      iVar7 = active_con_scaletext();
      DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,2,iVar3,iVar4,(char *)(ChatQueue + uVar9),
                        0x40001393,(ulong)(iVar7 == 0),0);
    }
    else {
      DCanvas::DrawText((DCanvas *)screen,SmallFont,3,0,iVar4,"Say: ",0x40001399,uVar11,0x4000139a,
                        local_50,0x400013a8,1,0);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,2,iVar3,iVar4,(char *)(ChatQueue + uVar9),
                        0x40001399,uVar11,0x4000139a,local_50,0x400013a8,1,0);
    }
    ChatQueue[len] = '\0';
    BorderTopRefresh =
         (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x20])();
  }
  lVar8 = (long)consoleplayer;
  lVar10 = (&DAT_00a60408)[lVar8 * 0x54];
  if (lVar10 != 0) {
    if ((*(byte *)(lVar10 + 0x20) & 0x20) == 0) {
      if ((((Button_ShowScores.bDown != '\0') || (*(int *)(lVar10 + 0x1cc) < 1)) ||
          (SB_ForceActive == true)) && (gamestate != GS_INTERMISSION)) {
        HU_DrawScores((player_t *)(&players + lVar8 * 0x54));
        return;
      }
    }
    else {
      (&DAT_00a60408)[lVar8 * 0x54] = 0;
    }
  }
  return;
}

Assistant:

void CT_Drawer (void)
{
	if (chatmodeon)
	{
		static const char *prompt = "Say: ";
		int i, x, scalex, y, promptwidth;

		y = (viewactive || gamestate != GS_LEVEL) ? -10 : -30;
		if (active_con_scaletext() == 0)
		{
			scalex = CleanXfac;
			y *= CleanYfac;
		}
		else
		{
			scalex = 1;
		}

		int screen_width, screen_height, st_y;
		if (active_con_scaletext() == 0)
		{
			screen_width = SCREENWIDTH;
			screen_height = SCREENHEIGHT;
			st_y = ST_Y;
		}
		else
		{
			screen_width = SCREENWIDTH / active_con_scaletext();
			screen_height = SCREENHEIGHT / active_con_scaletext();
			st_y = ST_Y / active_con_scaletext();
		}

		y += ((SCREENHEIGHT == viewheight && viewactive) || gamestate != GS_LEVEL) ? screen_height : st_y;

		promptwidth = SmallFont->StringWidth (prompt) * scalex;
		x = SmallFont->GetCharWidth ('_') * scalex * 2 + promptwidth;

		// figure out if the text is wider than the screen->
		// if so, only draw the right-most portion of it.
		for (i = len - 1; i >= 0 && x < screen_width; i--)
		{
			x += SmallFont->GetCharWidth (ChatQueue[i] & 0x7f) * scalex;
		}

		if (i >= 0)
		{
			i++;
		}
		else
		{
			i = 0;
		}

		// draw the prompt, text, and cursor
		ChatQueue[len] = SmallFont->GetCursor();
		ChatQueue[len+1] = '\0';
		if (active_con_scaletext() < 2)
		{
			screen->DrawText (SmallFont, CR_GREEN, 0, y, prompt, DTA_CleanNoMove, active_con_scaletext() == 0, TAG_DONE);
			screen->DrawText (SmallFont, CR_GREY, promptwidth, y, (char *)(ChatQueue + i), DTA_CleanNoMove, active_con_scaletext() == 0, TAG_DONE);
		}
		else
		{
			screen->DrawText (SmallFont, CR_GREEN, 0, y, prompt, 
				DTA_VirtualWidth, screen_width, DTA_VirtualHeight, screen_height, DTA_KeepRatio, true, TAG_DONE);
			screen->DrawText (SmallFont, CR_GREY, promptwidth, y, (char *)(ChatQueue + i), 
				DTA_VirtualWidth, screen_width, DTA_VirtualHeight, screen_height, DTA_KeepRatio, true, TAG_DONE);
		}
		ChatQueue[len] = '\0';

		BorderTopRefresh = screen->GetPageCount ();
	}

	if (players[consoleplayer].camera != NULL &&
		(Button_ShowScores.bDown ||
		 players[consoleplayer].camera->health <= 0 ||
		 SB_ForceActive) &&
		 // Don't draw during intermission, since it has its own scoreboard in wi_stuff.cpp.
		 gamestate != GS_INTERMISSION)
	{
		HU_DrawScores (&players[consoleplayer]);
	}
}